

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O0

void __thiscall
boost::runtime::arguments_store::set<bool>
          (arguments_store *this,cstring *parameter_name,bool *value)

{
  typed_argument<bool> *this_00;
  key_type *in_RDX;
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
  *in_RSI;
  shared_ptr<boost::runtime::argument> *in_RDI;
  typed_argument<bool> *in_stack_ffffffffffffffc8;
  shared_ptr<boost::runtime::argument> *in_stack_ffffffffffffffd0;
  
  this_00 = (typed_argument<bool> *)operator_new(0x18);
  typed_argument<bool>::typed_argument(this_00,(bool *)in_RDI);
  shared_ptr<boost::runtime::argument>::shared_ptr<boost::runtime::typed_argument<bool>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
  ::operator[](in_RSI,in_RDX);
  shared_ptr<boost::runtime::argument>::operator=
            ((shared_ptr<boost::runtime::argument> *)this_00,in_RDI);
  shared_ptr<boost::runtime::argument>::~shared_ptr
            ((shared_ptr<boost::runtime::argument> *)0x2626ef);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }